

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O0

uint * crnlib::crnlib_new_array<unsigned_int>(uint32 num)

{
  ulong size;
  void *pvVar1;
  uint *p;
  uint8 *q;
  uint64 total;
  uint *puStack_10;
  uint32 num_local;
  
  total._4_4_ = num;
  if (num == 0) {
    total._4_4_ = 1;
  }
  size = (ulong)total._4_4_ * 4 + 0x10;
  if (size < 0x400000001) {
    pvVar1 = crnlib_malloc(size);
    puStack_10 = (uint *)((long)pvVar1 + 0x10);
    *(uint32 *)((long)pvVar1 + 0xc) = total._4_4_;
    *(uint32 *)((long)pvVar1 + 8) = total._4_4_ ^ 0xffffffff;
  }
  else {
    crnlib_mem_error("crnlib_new_array: Array too large!");
    puStack_10 = (uint *)0x0;
  }
  return puStack_10;
}

Assistant:

inline T* crnlib_new_array(uint32 num)
    {
        if (!num)
        {
            num = 1;
        }

        uint64 total = CRNLIB_MIN_ALLOC_ALIGNMENT + sizeof(T) * num;
        if (total > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnlib_mem_error("crnlib_new_array: Array too large!");
            return nullptr;
        }
        uint8* q = static_cast<uint8*>(crnlib_malloc(static_cast<size_t>(total)));

        T* p = reinterpret_cast<T*>(q + CRNLIB_MIN_ALLOC_ALIGNMENT);

        reinterpret_cast<uint32*>(p)[-1] = num;
        reinterpret_cast<uint32*>(p)[-2] = ~num;

        if (!CRNLIB_IS_SCALAR_TYPE(T))
        {
            helpers::construct_array(p, num);
        }
        return p;
    }